

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall common::anon_unknown_0::CleanupHandler::~CleanupHandler(CleanupHandler *this)

{
  function<void_()> *this_00;
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Handler)._vptr_Handler = (_func_int **)&PTR__CleanupHandler_00a1b610;
  this_00 = &this->m_cleanup;
  if ((this->m_cleanup).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(this_00);
    std::function<void_()>::operator=(this_00,(nullptr_t)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::_Function_base::~_Function_base(&this_00->super__Function_base);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CleanupHandler() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }